

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFileBase.cpp
# Opt level: O1

char * fix_to_utf8(char *s,char **arena,char *arena_end)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  void *pvVar4;
  byte *pbVar5;
  
  pvVar4 = utf8valid(s);
  if (pvVar4 != (void *)0x0) {
    pbVar2 = (byte *)*arena;
    pbVar5 = pbVar2;
    do {
      bVar1 = *s;
      if (bVar1 == 0) {
        if (pbVar5 + 1 < arena_end) {
          *pbVar5 = 0;
          pbVar5 = pbVar5 + 1;
        }
        break;
      }
      if ((char)bVar1 < '\0') {
        if (pbVar5 + 2 < arena_end) {
          *pbVar5 = bVar1 >> 6 | 0xc0;
          pbVar5[1] = bVar1 & 0xbf;
          pbVar5 = pbVar5 + 2;
          goto LAB_001252b2;
        }
LAB_001252bd:
        bVar3 = false;
      }
      else {
        if (arena_end <= pbVar5 + 1) goto LAB_001252bd;
        *pbVar5 = bVar1;
        pbVar5 = pbVar5 + 1;
LAB_001252b2:
        s = (char *)((byte *)s + 1);
        bVar3 = true;
      }
    } while (bVar3);
    *arena = (char *)pbVar5;
    s = (char *)pbVar2;
  }
  return s;
}

Assistant:

char *fix_to_utf8(char *s, char **arena, char *arena_end) {
	if (!utf8valid(s)) {
		return s;
	}
	char *p     = *arena;
	char *begin = p;
	while (*s) {
		uint32_t c = (uint8_t)*s;
		if (c < 0x80) {
			if (p + 1 >= arena_end) goto done;
			*p++ = c;
		} else {
			if (p + 2 >= arena_end) goto done;
			*p++ = 0xc0 | (c >> 6);
			*p++ = 0x80 | (c & 0x3f);
		}
		++s;
	}
	if (p + 1 >= arena_end) goto done;
	*p++ = 0;
done:
	*arena = p;
	return begin;
}